

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O2

void dxil_spv::emit_buffer_synchronization_validation
               (Impl *impl,CallInst *instruction,BDAOperation bda_operation)

{
  ResourceKind RVar1;
  uint uVar2;
  Id IVar3;
  bool bVar4;
  Id type_id;
  RawWidth RVar5;
  Id arg;
  Id IVar6;
  Id IVar7;
  Value *pVVar8;
  mapped_type *pmVar9;
  Builder *this;
  Type *pTVar10;
  Constant *this_00;
  APInt *this_01;
  uint64_t uVar11;
  Operation *pOVar12;
  Operation *pOVar13;
  mapped_type *pmVar14;
  byte bVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  Id local_68;
  Id local_64;
  Id image_id;
  CallInst *local_38;
  
  if ((impl->options).instruction_instrumentation.enabled != true) {
    return;
  }
  if ((impl->options).instruction_instrumentation.type != BufferSynchronizationValidation) {
    return;
  }
  pVVar8 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  image_id = Converter::Impl::get_id_for_value(impl,pVVar8,0);
  pmVar9 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&impl->handle_to_resource_meta,&image_id);
  if ((pmVar9->storage != StorageClassPhysicalStorageBuffer) &&
     ((pmVar9->instrumentation).bda_id == 0)) {
    return;
  }
  this = Converter::Impl::builder(impl);
  if (bda_operation < AtomicRMW) {
    if (bda_operation == Store) {
      pVVar8 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,4);
      pTVar10 = LLVMBC::Value::getType(pVVar8);
    }
    else {
      pTVar10 = LLVMBC::Value::getType((Value *)instruction);
      pTVar10 = LLVMBC::Type::getStructElementType(pTVar10,0);
    }
    RVar1 = pmVar9->kind;
    local_64 = 0;
    arg = 0;
    if ((byte)(RVar1 - RawBuffer) < 2) {
      if (bda_operation == Load) {
        local_38 = instruction;
        pmVar14 = std::__detail::
                  _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&impl->llvm_composite_meta,(key_type *)&local_38);
        uVar18 = pmVar14->access_mask & 0xf;
      }
      else {
        pVVar8 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,8);
        this_00 = &LLVMBC::cast<LLVMBC::ConstantInt>(pVVar8)->super_Constant;
        this_01 = LLVMBC::Constant::getUniqueInteger(this_00);
        uVar11 = LLVMBC::APInt::getZExtValue(this_01);
        uVar18 = (uint)uVar11;
      }
      RVar5 = get_buffer_access_bits_per_component(impl,pmVar9->storage,pTVar10);
      uVar16 = 0;
      uVar17 = 0;
      while (uVar16 != 4) {
        uVar2 = uVar16 & 0x1f;
        uVar16 = uVar16 + 1;
        if ((uVar18 >> uVar2 & 1) != 0) {
          uVar17 = uVar16;
        }
      }
      bVar15 = 6;
      if (RVar5 != B64) {
        bVar15 = RVar5 == B16 ^ 5;
      }
      arg = spv::Builder::makeUintConstant(this,(uVar17 << bVar15) >> 3,false);
      RVar1 = pmVar9->kind;
    }
    pVVar8 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2);
    IVar6 = Converter::Impl::get_id_for_value(impl,pVVar8,0);
    if (RVar1 == TypedBuffer) {
      IVar7 = (pmVar9->instrumentation).elem_size_id;
      local_68 = 0;
      arg = IVar7;
    }
    else {
      IVar3 = IVar6;
      if (RVar1 == RawBuffer) goto LAB_00164ba1;
      if (RVar1 == StructuredBuffer) {
        pVVar8 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,3);
        bVar4 = LLVMBC::isa<LLVMBC::UndefValue>(pVVar8);
        local_68 = 0;
        if (!bVar4) {
          pVVar8 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,3);
          local_68 = Converter::Impl::get_id_for_value(impl,pVVar8,0);
        }
        IVar7 = spv::Builder::makeUintConstant(this,pmVar9->stride,false);
      }
      else {
        local_68 = 0;
        IVar7 = spv::Builder::makeUintConstant(this,0x10,false);
        arg = IVar7;
      }
    }
  }
  else {
    bVar4 = value_is_dx_op_instrinsic((Value *)instruction,AtomicCompareExchange);
    uVar18 = bVar4 ^ 3;
    RVar1 = pmVar9->kind;
    if (RVar1 == TypedBuffer) {
      pVVar8 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,uVar18);
      local_68 = 0;
      IVar6 = Converter::Impl::get_id_for_value(impl,pVVar8,0);
      IVar7 = (pmVar9->instrumentation).elem_size_id;
    }
    else if (RVar1 == StructuredBuffer) {
      pVVar8 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,uVar18);
      local_68 = 0;
      IVar6 = Converter::Impl::get_id_for_value(impl,pVVar8,0);
      pVVar8 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,uVar18 + 1);
      bVar4 = LLVMBC::isa<LLVMBC::UndefValue>(pVVar8);
      if (!bVar4) {
        pVVar8 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,uVar18 + 1);
        local_68 = Converter::Impl::get_id_for_value(impl,pVVar8,0);
      }
      IVar7 = spv::Builder::makeUintConstant(this,pmVar9->stride,false);
    }
    else {
      IVar6 = 0;
      local_68 = 0;
      IVar7 = 0;
      if (RVar1 == RawBuffer) {
        pVVar8 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,uVar18);
        IVar6 = 0;
        local_68 = Converter::Impl::get_id_for_value(impl,pVVar8,0);
        IVar7 = 0;
      }
    }
    pTVar10 = LLVMBC::Value::getType((Value *)instruction);
    uVar18 = LLVMBC::Type::getIntegerBitWidth(pTVar10);
    arg = spv::Builder::makeUintConstant(this,uVar18 >> 3,false);
  }
  IVar3 = local_68;
  if (IVar6 == 0) {
    local_64 = 0;
  }
  else {
    type_id = spv::Builder::makeUintType(this,0x20);
    pOVar12 = Converter::Impl::allocate(impl,OpIMul,type_id);
    Operation::add_id(pOVar12,IVar6);
    Operation::add_id(pOVar12,IVar7);
    Converter::Impl::add(impl,pOVar12,false);
    IVar7 = pOVar12->id;
    local_64 = IVar6;
    if ((IVar7 != 0) && (IVar3 = IVar7, local_68 != 0)) {
      IVar6 = spv::Builder::makeUintType(this,0x20);
      pOVar12 = Converter::Impl::allocate(impl,OpIAdd,IVar6);
      Operation::add_id(pOVar12,IVar7);
      Operation::add_id(pOVar12,local_68);
      Converter::Impl::add(impl,pOVar12,false);
      IVar3 = pOVar12->id;
    }
  }
LAB_00164ba1:
  local_68 = IVar3;
  IVar7 = SPIRVModule::get_helper_call_id(impl->spirv_module,ValidateBDALoadStore,0);
  IVar6 = spv::Builder::makeBoolType(this);
  pOVar12 = Converter::Impl::allocate(impl,OpFunctionCall,IVar6);
  Operation::add_id(pOVar12,IVar7);
  IVar7 = (pmVar9->instrumentation).bda_id;
  if (IVar7 == 0) {
    pVVar8 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
    IVar7 = Converter::Impl::get_id_for_value(impl,pVVar8,0);
  }
  Operation::add_id(pOVar12,IVar7);
  Operation::add_id(pOVar12,local_68);
  Operation::add_id(pOVar12,arg);
  IVar7 = spv::Builder::makeUintConstant(this,bda_operation,false);
  Operation::add_id(pOVar12,IVar7);
  IVar7 = spv::Builder::makeUintType(this,0x20);
  pOVar13 = Converter::Impl::allocate(impl,OpLoad,IVar7);
  Operation::add_id(pOVar13,(impl->instrumentation).invocation_id_var_id);
  Converter::Impl::add(impl,pOVar13,false);
  Operation::add_id(pOVar12,pOVar13->id);
  if ((pmVar9->instrumentation).resource_size_id == 0) {
    IVar7 = spv::Builder::makeBoolConstant(this,true,false);
  }
  else {
    IVar7 = spv::Builder::makeBoolType(this);
    pOVar13 = Converter::Impl::allocate(impl,OpULessThan,IVar7);
    if (pmVar9->kind == TypedBuffer) {
      local_68 = local_64;
    }
    Operation::add_id(pOVar13,local_68);
    Operation::add_id(pOVar13,(pmVar9->instrumentation).resource_size_id);
    Converter::Impl::add(impl,pOVar13,false);
    IVar7 = pOVar13->id;
  }
  Operation::add_id(pOVar12,IVar7);
  Converter::Impl::add(impl,pOVar12,false);
  pOVar13 = Converter::Impl::allocate(impl,OpAssumeTrueKHR);
  Operation::add_id(pOVar13,pOVar12->id);
  Converter::Impl::add(impl,pOVar13,false);
  return;
}

Assistant:

void emit_buffer_synchronization_validation(Converter::Impl &impl,
                                            const llvm::CallInst *instruction,
                                            BDAOperation bda_operation)
{
	if (!impl.options.instruction_instrumentation.enabled ||
	    impl.options.instruction_instrumentation.type != InstructionInstrumentationType::BufferSynchronizationValidation)
	{
		return;
	}

	spv::Id image_id = impl.get_id_for_value(instruction->getOperand(1));
	const auto &meta = impl.handle_to_resource_meta[image_id];

	if (meta.storage != spv::StorageClassPhysicalStorageBuffer && meta.instrumentation.bda_id == 0)
		return;

	auto &builder = impl.builder();
	spv::Id stride_id = 0;
	spv::Id offset_id = 0;
	spv::Id elem_id = 0;
	spv::Id len_id = 0;

	if (bda_operation == BDAOperation::Store || bda_operation == BDAOperation::Load)
	{
		const llvm::Type *element_type;
		if (bda_operation == BDAOperation::Store)
			element_type = instruction->getOperand(4)->getType();
		else
			element_type = instruction->getType()->getStructElementType(0);

		if (meta.kind == DXIL::ResourceKind::RawBuffer || meta.kind == DXIL::ResourceKind::StructuredBuffer)
		{
			unsigned mask;

			if (bda_operation == BDAOperation::Load)
			{
				auto &access_meta = impl.llvm_composite_meta[instruction];
				mask = access_meta.access_mask & 0xf;
			}
			else
			{
				mask = llvm::cast<llvm::ConstantInt>(instruction->getOperand(8))->getUniqueInteger().getZExtValue();
			}

			unsigned width = raw_width_to_bits(get_buffer_access_bits_per_component(impl, meta.storage, element_type));

			unsigned num_elems = 0;
			for (unsigned i = 0; i < 4; i++)
				if ((mask & (1u << i)) != 0)
					num_elems = i + 1;

			len_id = builder.makeUintConstant(num_elems * width / 8);
		}

		if (meta.kind == DXIL::ResourceKind::RawBuffer)
		{
			offset_id = impl.get_id_for_value(instruction->getOperand(2));
		}
		else if (meta.kind == DXIL::ResourceKind::StructuredBuffer)
		{
			elem_id = impl.get_id_for_value(instruction->getOperand(2));
			if (!llvm::isa<llvm::UndefValue>(instruction->getOperand(3)))
				offset_id = impl.get_id_for_value(instruction->getOperand(3));
			stride_id = builder.makeUintConstant(meta.stride);
		}
		else if (meta.kind == DXIL::ResourceKind::TypedBuffer)
		{
			elem_id = impl.get_id_for_value(instruction->getOperand(2));
			stride_id = meta.instrumentation.elem_size_id;
			len_id = meta.instrumentation.elem_size_id;
		}
		else
		{
			elem_id = impl.get_id_for_value(instruction->getOperand(2));
			stride_id = builder.makeUintConstant(16);
			len_id = stride_id;
		}
	}
	else
	{
		unsigned elem_index;

		if (value_is_dx_op_instrinsic(instruction, DXIL::Op::AtomicCompareExchange))
			elem_index = 2;
		else
			elem_index = 3;

		if (meta.kind == DXIL::ResourceKind::RawBuffer)
		{
			offset_id = impl.get_id_for_value(instruction->getOperand(elem_index));
		}
		else if (meta.kind == DXIL::ResourceKind::StructuredBuffer)
		{
			elem_id = impl.get_id_for_value(instruction->getOperand(elem_index));
			if (!llvm::isa<llvm::UndefValue>(instruction->getOperand(elem_index + 1)))
				offset_id = impl.get_id_for_value(instruction->getOperand(elem_index + 1));
			stride_id = builder.makeUintConstant(meta.stride);
		}
		else if (meta.kind == DXIL::ResourceKind::TypedBuffer)
		{
			elem_id = impl.get_id_for_value(instruction->getOperand(elem_index));
			stride_id = meta.instrumentation.elem_size_id;
		}

		len_id = builder.makeUintConstant(instruction->getType()->getIntegerBitWidth() / 8);
	}

	spv::Id total_offset_id = 0;

	if (elem_id != 0)
	{
		auto *mul = impl.allocate(spv::OpIMul, builder.makeUintType(32));
		mul->add_id(elem_id);
		mul->add_id(stride_id);
		impl.add(mul);
		total_offset_id = mul->id;
	}

	if (!total_offset_id)
	{
		total_offset_id = offset_id;
	}
	else if (offset_id != 0)
	{
		auto *add = impl.allocate(spv::OpIAdd, builder.makeUintType(32));
		add->add_id(total_offset_id);
		add->add_id(offset_id);
		impl.add(add);
		total_offset_id = add->id;
	}

	spv::Id call_id = impl.spirv_module.get_helper_call_id(HelperCall::ValidateBDALoadStore);
	auto *call = impl.allocate(spv::OpFunctionCall, builder.makeBoolType());
	call->add_id(call_id);
	call->add_id(meta.instrumentation.bda_id ? meta.instrumentation.bda_id : impl.get_id_for_value(instruction->getOperand(1)));
	call->add_id(total_offset_id);
	call->add_id(len_id);
	call->add_id(builder.makeUintConstant(unsigned(bda_operation)));

	auto *load_invocation_id = impl.allocate(spv::OpLoad, builder.makeUintType(32));
	load_invocation_id->add_id(impl.instrumentation.invocation_id_var_id);
	impl.add(load_invocation_id);

	call->add_id(load_invocation_id->id);

	if (meta.instrumentation.resource_size_id)
	{
		auto *in_bounds = impl.allocate(spv::OpULessThan, builder.makeBoolType());

		if (meta.kind == DXIL::ResourceKind::TypedBuffer)
			in_bounds->add_id(elem_id);
		else
			in_bounds->add_id(total_offset_id);
		in_bounds->add_id(meta.instrumentation.resource_size_id);

		impl.add(in_bounds);
		call->add_id(in_bounds->id);
	}
	else
	{
		call->add_id(builder.makeBoolConstant(true));
	}

	impl.add(call);

	auto *expect_true = impl.allocate(spv::OpAssumeTrueKHR);
	expect_true->add_id(call->id);
	impl.add(expect_true);
}